

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

void __thiscall
QPDF::EncryptionData::setV5EncryptionParameters
          (EncryptionData *this,string *O,string *OE,string *U,string *UE,string *Perms)

{
  std::__cxx11::string::_M_assign((string *)&this->O);
  std::__cxx11::string::_M_assign((string *)&this->OE);
  std::__cxx11::string::_M_assign((string *)&this->U);
  std::__cxx11::string::_M_assign((string *)&this->UE);
  std::__cxx11::string::_M_assign((string *)&this->Perms);
  return;
}

Assistant:

void
QPDF::EncryptionData::setV5EncryptionParameters(
    std::string const& O,
    std::string const& OE,
    std::string const& U,
    std::string const& UE,
    std::string const& Perms)
{
    this->O = O;
    this->OE = OE;
    this->U = U;
    this->UE = UE;
    this->Perms = Perms;
}